

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O0

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::rm<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,value_t *pipe_,
          _func_void_uchar_ptr_size_t_xpub_t_ptr *func_,xpub_t *arg_,bool call_on_uniq_)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  reference __src;
  size_type sVar5;
  void *pvVar6;
  undefined8 in_RCX;
  code *in_RDX;
  long *in_RDI;
  byte in_R8B;
  generic_mtrie_t<zmq::pipe_t> **old_table;
  generic_mtrie_t<zmq::pipe_t> *node;
  iter next_1;
  iter next;
  iter it;
  size_t maxbuffsize;
  uchar *buff;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  stack;
  key_type *in_stack_fffffffffffffe48;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
  *in_stack_fffffffffffffe50;
  value_type *in_stack_fffffffffffffe58;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  *in_stack_fffffffffffffe60;
  generic_mtrie_t<zmq::pipe_t> *in_stack_fffffffffffffe70;
  long *local_78;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  undefined4 local_58;
  byte local_54;
  size_t local_50;
  void *local_48;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  local_40;
  byte local_21;
  undefined8 local_20;
  code *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ::list((list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          *)0x212718);
  local_48 = (void *)0x0;
  local_50 = 0;
  local_70 = 0;
  local_68 = 0;
  local_60 = 0;
  local_58 = 0;
  local_54 = 0;
  local_78 = in_RDI;
  std::__cxx11::
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  while (bVar3 = std::__cxx11::
                 list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                 ::empty(&local_40), ((bVar3 ^ 0xffU) & 1) != 0) {
    __src = std::__cxx11::
            list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            ::back((list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                    *)in_stack_fffffffffffffe50);
    memcpy(&local_78,__src,0x28);
    std::__cxx11::
    list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
    ::pop_back((list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                *)in_stack_fffffffffffffe50);
    if ((local_54 & 1) == 0) {
      if ((*local_78 != 0) &&
         (sVar5 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                  ::erase(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48), sVar5 != 0)) {
        if (((local_21 & 1) == 0) ||
           (bVar3 = std::
                    set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::
                    empty((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                           *)0x212854), bVar3)) {
          (*local_18)(local_48,local_60,local_20);
        }
        bVar3 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::
                empty((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                       *)0x2128b6);
        if (bVar3) {
          pvVar1 = (void *)*local_78;
          if (pvVar1 != (void *)0x0) {
            std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::~set
                      ((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                        *)0x2128e2);
            operator_delete(pvVar1,0x30);
          }
          *local_78 = 0;
        }
      }
      if (local_50 <= local_60) {
        local_50 = local_60 + 0x100;
        local_48 = realloc(local_48,local_50);
        if (local_48 == (void *)0x0) {
          fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                  ,0xca);
          fflush(_stderr);
          zmq_abort((char *)0x2129ac);
        }
      }
      if (*(short *)((long)local_78 + 10) != 0) {
        if (*(short *)((long)local_78 + 10) == 1) {
          *(char *)((long)local_48 + local_60) = (char)local_78[1];
          local_54 = 1;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          local_60 = local_60 + 1;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        else {
          if ((ushort)local_58 == 0) {
            local_58 = (uint)CONCAT11((char)local_78[1],
                                      (char)local_78[1] + (char)*(undefined2 *)((long)local_78 + 10)
                                      + -1) << 0x10;
          }
          *(char *)((long)local_48 + local_60) = (char)(int)local_78[1] + (char)local_58;
          local_54 = 1;
          std::__cxx11::
          list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
          ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          if (*(long *)(local_78[2] + (ulong)(ushort)local_58 * 8) != 0) {
            std::__cxx11::
            list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          }
        }
      }
    }
    else {
      local_54 = 0;
      if (*(short *)((long)local_78 + 10) != 0) {
        if (*(short *)((long)local_78 + 10) == 1) {
          bVar3 = is_redundant((generic_mtrie_t<zmq::pipe_t> *)local_78[2]);
          if (bVar3) {
            pvVar1 = (void *)local_78[2];
            if (pvVar1 != (void *)0x0) {
              ~generic_mtrie_t(in_stack_fffffffffffffe70);
              operator_delete(pvVar1,0x18);
            }
            local_78[2] = 0;
            *(undefined2 *)((long)local_78 + 10) = 0;
            *(short *)((long)local_78 + 0xc) = *(short *)((long)local_78 + 0xc) + -1;
            if (*(short *)((long)local_78 + 0xc) != 0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x116);
              fflush(_stderr);
              zmq_abort((char *)0x212d16);
            }
          }
        }
        else {
          if (*(long *)(local_78[2] + (ulong)(ushort)local_58 * 8) != 0) {
            bVar3 = is_redundant(*(generic_mtrie_t<zmq::pipe_t> **)
                                  (local_78[2] + (ulong)(ushort)local_58 * 8));
            if (bVar3) {
              pvVar1 = *(void **)(local_78[2] + (ulong)(ushort)local_58 * 8);
              if (pvVar1 != (void *)0x0) {
                ~generic_mtrie_t(in_stack_fffffffffffffe70);
                operator_delete(pvVar1,0x18);
              }
              *(undefined8 *)(local_78[2] + (ulong)(ushort)local_58 * 8) = 0;
              if (*(short *)((long)local_78 + 0xc) == 0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x123);
                fflush(_stderr);
                zmq_abort((char *)0x212e38);
              }
              *(short *)((long)local_78 + 0xc) = *(short *)((long)local_78 + 0xc) + -1;
            }
            else {
              if ((local_58 & 0xffff) + (uint)*(byte *)(local_78 + 1) < (local_58 >> 0x10 & 0xff)) {
                local_58._0_3_ = CONCAT12((char)local_58 + (char)local_78[1],(ushort)local_58);
              }
              if (local_58 >> 0x18 < (local_58 & 0xffff) + (uint)*(byte *)(local_78 + 1)) {
                local_58 = CONCAT13((char)local_58 + (char)local_78[1],(undefined3)local_58);
              }
            }
          }
          uVar4 = (ushort)local_58 + 1;
          local_58 = CONCAT22(local_58._2_2_,uVar4);
          if (uVar4 < *(ushort *)((long)local_78 + 10)) {
            std::__cxx11::
            list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
            ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          }
          else {
            local_58 = (uint)local_58._2_2_ << 0x10;
            if (*(ushort *)((long)local_78 + 10) < 2) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_count > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x147);
              fflush(_stderr);
              zmq_abort((char *)0x212f97);
            }
            if (*(short *)((long)local_78 + 0xc) == 0) {
              free((void *)local_78[2]);
              local_78[2] = 0;
              *(undefined2 *)((long)local_78 + 10) = 0;
            }
            else if (*(short *)((long)local_78 + 0xc) == 1) {
              if (local_58._2_1_ != local_58._3_1_) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min == it.new_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x156);
                fflush(_stderr);
                zmq_abort((char *)0x213062);
              }
              if (local_58._2_1_ < *(byte *)(local_78 + 1)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x157);
                fflush(_stderr);
                zmq_abort((char *)0x2130d9);
              }
              if ((uint)*(byte *)(local_78 + 1) + (uint)*(ushort *)((long)local_78 + 10) <=
                  (local_58 >> 0x10 & 0xff)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min < it.node->_min + it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x159);
                fflush(_stderr);
                zmq_abort((char *)0x21315e);
              }
              lVar2 = *(long *)(local_78[2] +
                               (long)(int)((local_58 >> 0x10 & 0xff) - (uint)*(byte *)(local_78 + 1)
                                          ) * 8);
              if (lVar2 == 0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","node",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x15e);
                fflush(_stderr);
                zmq_abort((char *)0x2131f7);
              }
              free((void *)local_78[2]);
              local_78[2] = lVar2;
              *(undefined2 *)((long)local_78 + 10) = 1;
              *(byte *)(local_78 + 1) = local_58._2_1_;
            }
            else if ((*(byte *)(local_78 + 1) < local_58._2_1_) ||
                    ((int)(uint)local_58._3_1_ <
                     (int)((uint)*(byte *)(local_78 + 1) + (uint)*(ushort *)((long)local_78 + 10) +
                          -1))) {
              if ((int)(((uint)local_58._3_1_ - (uint)local_58._2_1_) + 1) < 2) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_max - it.new_min + 1 > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x16a);
                fflush(_stderr);
                zmq_abort((char *)0x2132ff);
              }
              pvVar1 = (void *)local_78[2];
              bVar3 = true;
              if (local_58._2_1_ <= *(byte *)(local_78 + 1)) {
                bVar3 = (int)(local_58 >> 0x18) <
                        (int)((uint)*(byte *)(local_78 + 1) + (uint)*(ushort *)((long)local_78 + 10)
                             + -1);
              }
              if (!bVar3) {
                in_stack_fffffffffffffe70 = (generic_mtrie_t<zmq::pipe_t> *)&stderr;
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x171);
                fflush((FILE *)in_stack_fffffffffffffe70->_pipes);
                zmq_abort((char *)0x2133bf);
              }
              if (local_58._2_1_ < *(byte *)(local_78 + 1)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x172);
                fflush(_stderr);
                zmq_abort((char *)0x213436);
              }
              if ((int)((uint)*(byte *)(local_78 + 1) + (uint)*(ushort *)((long)local_78 + 10) + -1)
                  < (int)(local_58 >> 0x18)) {
                in_stack_fffffffffffffe60 =
                     (list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                      *)&stderr;
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max <= it.node->_min + it.node->_count - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x175);
                fflush((FILE *)(in_stack_fffffffffffffe60->
                               super__List_base<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
                               )._M_impl._M_node.super__List_node_base._M_next);
                zmq_abort((char *)0x2134be);
              }
              if ((int)(uint)*(ushort *)((long)local_78 + 10) <=
                  (int)(((local_58 >> 0x18) - (local_58 >> 0x10 & 0xff)) + 1)) {
                in_stack_fffffffffffffe58 = (value_type *)&stderr;
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max - it.new_min + 1 < it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x177);
                fflush((FILE *)in_stack_fffffffffffffe58->node);
                zmq_abort((char *)0x213542);
              }
              *(ushort *)((long)local_78 + 10) =
                   ((ushort)local_58._3_1_ - (ushort)local_58._2_1_) + 1;
              pvVar6 = malloc((ulong)*(ushort *)((long)local_78 + 10) << 3);
              local_78[2] = (long)pvVar6;
              if (local_78[2] == 0) {
                in_stack_fffffffffffffe50 =
                     (set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *
                     )&stderr;
                fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x17f);
                fflush(*(FILE **)&(in_stack_fffffffffffffe50->_M_t)._M_impl);
                zmq_abort((char *)0x2135f0);
              }
              memmove((void *)local_78[2],
                      (void *)((long)pvVar1 +
                              (long)(int)((local_58 >> 0x10 & 0xff) - (uint)*(byte *)(local_78 + 1))
                              * 8),(ulong)*(ushort *)((long)local_78 + 10) << 3);
              free(pvVar1);
              *(byte *)(local_78 + 1) = local_58._2_1_;
            }
          }
        }
      }
    }
  }
  free(local_48);
  std::__cxx11::
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  ::~list((list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
           *)0x213686);
  return;
}

Assistant:

void generic_mtrie_t<T>::rm (value_t *pipe_,
                             void (*func_) (prefix_t data_,
                                            size_t size_,
                                            Arg arg_),
                             Arg arg_,
                             bool call_on_uniq_)
{
    //  This used to be implemented as a non-tail recursive travesal of the trie,
    //  which means remote clients controlled the depth of the recursion and the
    //  stack size.
    //  To simulate the non-tail recursion, with post-recursion changes depending on
    //  the result of the recursive call, a stack is used to re-visit the same node
    //  and operate on it again after children have been visisted.
    //  A boolean is used to record whether the node had already been visited and to
    //  determine if the pre- or post- children visit actions have to be taken.
    //  In the case of a node with (N > 1) children, the node has to be re-visited
    //  N times, in the correct order after each child visit.
    std::list<struct iter> stack;
    unsigned char *buff = NULL;
    size_t maxbuffsize = 0;
    struct iter it = {this, NULL, NULL, 0, 0, 0, 0, false};
    stack.push_back (it);

    while (!stack.empty ()) {
        it = stack.back ();
        stack.pop_back ();

        if (!it.processed_for_removal) {
            //  Remove the subscription from this node.
            if (it.node->_pipes && it.node->_pipes->erase (pipe_)) {
                if (!call_on_uniq_ || it.node->_pipes->empty ()) {
                    func_ (buff, it.size, arg_);
                }

                if (it.node->_pipes->empty ()) {
                    LIBZMQ_DELETE (it.node->_pipes);
                }
            }

            //  Adjust the buffer.
            if (it.size >= maxbuffsize) {
                maxbuffsize = it.size + 256;
                buff =
                  static_cast<unsigned char *> (realloc (buff, maxbuffsize));
                alloc_assert (buff);
            }

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  pre-processing.
                    break;
                case 1: {
                    //  If there's one subnode (optimisation).

                    buff[it.size] = it.node->_min;
                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    struct iter next = {it.node->_next.node,
                                        NULL,
                                        NULL,
                                        ++it.size,
                                        0,
                                        0,
                                        0,
                                        false};
                    stack.push_back (next);
                    break;
                }
                default: {
                    //  If there are multiple subnodes.
                    //  When first visiting this node, initialize the new_min/max parameters
                    //  which will then be used after each child has been processed, on the
                    //  post-children iterations.
                    if (it.current_child == 0) {
                        //  New min non-null character in the node table after the removal
                        it.new_min = it.node->_min + it.node->_count - 1;
                        //  New max non-null character in the node table after the removal
                        it.new_max = it.node->_min;
                    }

                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    buff[it.size] = it.node->_min + it.current_child;
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    if (it.node->_next.table[it.current_child]) {
                        struct iter next = {
                          it.node->_next.table[it.current_child],
                          NULL,
                          NULL,
                          it.size + 1,
                          0,
                          0,
                          0,
                          false};
                        stack.push_back (next);
                    }
                }
            }
        } else {
            //  Reset back for the next time, in case this node doesn't get deleted.
            //  This is done unconditionally, unlike when setting this variable to true.
            it.processed_for_removal = false;

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  post-processing.
                    break;
                case 1:
                    //  If there's one subnode (optimisation).

                    //  Prune the node if it was made redundant by the removal
                    if (it.node->_next.node->is_redundant ()) {
                        LIBZMQ_DELETE (it.node->_next.node);
                        it.node->_count = 0;
                        --it.node->_live_nodes;
                        zmq_assert (it.node->_live_nodes == 0);
                    }
                    break;
                default:
                    //  If there are multiple subnodes.
                    {
                        if (it.node->_next.table[it.current_child]) {
                            //  Prune redundant nodes from the mtrie
                            if (it.node->_next.table[it.current_child]
                                  ->is_redundant ()) {
                                LIBZMQ_DELETE (
                                  it.node->_next.table[it.current_child]);

                                zmq_assert (it.node->_live_nodes > 0);
                                --it.node->_live_nodes;
                            } else {
                                //  The node is not redundant, so it's a candidate for being
                                //  the new min/max node.
                                //
                                //  We loop through the node array from left to right, so the
                                //  first non-null, non-redundant node encountered is the new
                                //  minimum index. Conversely, the last non-redundant, non-null
                                //  node encountered is the new maximum index.
                                if (it.current_child + it.node->_min
                                    < it.new_min)
                                    it.new_min =
                                      it.current_child + it.node->_min;
                                if (it.current_child + it.node->_min
                                    > it.new_max)
                                    it.new_max =
                                      it.current_child + it.node->_min;
                            }
                        }

                        //  If there are more children to visit, push again the current
                        //  node, so that pre-processing can happen on the next child.
                        //  If we are done, reset the child index so that the ::rm is
                        //  fully idempotent.
                        ++it.current_child;
                        if (it.current_child >= it.node->_count)
                            it.current_child = 0;
                        else {
                            stack.push_back (it);
                            continue;
                        }

                        //  All children have been visited and removed if needed, and
                        //  all pre- and post-visit operations have been carried.
                        //  Resize/free the node table if needed.
                        zmq_assert (it.node->_count > 1);

                        //  Free the node table if it's no longer used.
                        switch (it.node->_live_nodes) {
                            case 0:
                                free (it.node->_next.table);
                                it.node->_next.table = NULL;
                                it.node->_count = 0;
                                break;
                            case 1:
                                //  Compact the node table if possible

                                //  If there's only one live node in the table we can
                                //  switch to using the more compact single-node
                                //  representation
                                zmq_assert (it.new_min == it.new_max);
                                zmq_assert (it.new_min >= it.node->_min);
                                zmq_assert (it.new_min
                                            < it.node->_min + it.node->_count);
                                {
                                    generic_mtrie_t *node =
                                      it.node->_next
                                        .table[it.new_min - it.node->_min];
                                    zmq_assert (node);
                                    free (it.node->_next.table);
                                    it.node->_next.node = node;
                                }
                                it.node->_count = 1;
                                it.node->_min = it.new_min;
                                break;
                            default:
                                if (it.new_min > it.node->_min
                                    || it.new_max < it.node->_min
                                                      + it.node->_count - 1) {
                                    zmq_assert (it.new_max - it.new_min + 1
                                                > 1);

                                    generic_mtrie_t **old_table =
                                      it.node->_next.table;
                                    zmq_assert (it.new_min > it.node->_min
                                                || it.new_max
                                                     < it.node->_min
                                                         + it.node->_count - 1);
                                    zmq_assert (it.new_min >= it.node->_min);
                                    zmq_assert (it.new_max
                                                <= it.node->_min
                                                     + it.node->_count - 1);
                                    zmq_assert (it.new_max - it.new_min + 1
                                                < it.node->_count);

                                    it.node->_count =
                                      it.new_max - it.new_min + 1;
                                    it.node->_next.table =
                                      static_cast<generic_mtrie_t **> (
                                        malloc (sizeof (generic_mtrie_t *)
                                                * it.node->_count));
                                    alloc_assert (it.node->_next.table);

                                    memmove (it.node->_next.table,
                                             old_table
                                               + (it.new_min - it.node->_min),
                                             sizeof (generic_mtrie_t *)
                                               * it.node->_count);
                                    free (old_table);

                                    it.node->_min = it.new_min;
                                }
                        }
                    }
            }
        }
    }

    free (buff);
}